

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int try_unknown_verb(voccxdef *ctx,objnum actor,char **cmd,int *typelist,int wrdcnt,int *next_start,
                    int do_fuses,int vocerr_err,char *vocerr_msg,...)

{
  long lVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  short in_SI;
  undefined8 *in_RDI;
  int in_R8D;
  int *in_R9;
  vocerr_va_info info;
  errdef fr_;
  int do_fuses_1;
  int i;
  int err;
  va_list argptr;
  int show_msg;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  undefined2 in_stack_fffffffffffffbec;
  objnum in_stack_fffffffffffffbee;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  vocerr_va_info *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  uint in_stack_fffffffffffffc04;
  char **in_stack_fffffffffffffc08;
  voccxdef *in_stack_fffffffffffffc10;
  __va_list_tag *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcf4;
  vocerr_va_info *in_stack_fffffffffffffcf8;
  voccxdef *in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd1c;
  objnum in_stack_fffffffffffffd1e;
  undefined4 in_stack_fffffffffffffd20;
  objnum in_stack_fffffffffffffd24;
  objnum in_stack_fffffffffffffd26;
  int in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  voccxdef *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd40;
  objnum in_stack_fffffffffffffd48;
  objnum in_stack_fffffffffffffd50;
  undefined8 local_1a0;
  int local_198;
  __jmp_buf_tag _Stack_130;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined1 *local_50;
  undefined1 *local_48;
  int local_3c;
  int *local_38;
  int local_2c;
  long local_28;
  long local_20;
  short local_12;
  undefined8 *local_10;
  
  local_3c = 0;
  local_2c = in_R8D;
  if (in_R8D == 0) {
    while (*(long *)(in_RDX + (long)local_2c * 8) != 0) {
      local_2c = local_2c + 1;
    }
  }
  iVar2 = in_stack_fffffffffffffbf4;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_12 = in_SI;
  local_10 = in_RDI;
  if (*(short *)((long)in_RDI + 0x1104) == -1) goto LAB_00235d87;
  local_5c = 0;
  local_64 = 1;
  runpnum((runcxdef *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
          CONCAT26(in_stack_fffffffffffffbee,
                   CONCAT24(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)));
  voc_push_numlist((voccxdef *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (uint *)CONCAT26(in_stack_fffffffffffffbee,
                                    CONCAT24(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)),
                   in_stack_fffffffffffffbe4);
  voc_push_toklist(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
  if (local_12 == -1) {
    local_12 = *(short *)(local_10 + 0x1e8);
  }
  runpobj((runcxdef *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
          in_stack_fffffffffffffbee);
  iVar2 = _setjmp(&_Stack_130);
  local_198 = iVar2;
  if (iVar2 == 0) {
    local_1a0 = *(undefined8 *)*local_10;
    *(undefined8 **)*local_10 = &local_1a0;
    runfn((runcxdef *)
          CONCAT26(in_stack_fffffffffffffd26,
                   CONCAT24(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)),
          in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18);
    in_stack_fffffffffffffc04 = (uint)*(byte *)(*(long *)(local_10[2] + 0x20) + -0x10);
    if (in_stack_fffffffffffffc04 == 1) {
      lVar1 = *(long *)(local_10[2] + 0x20);
      *(long *)(local_10[2] + 0x20) = lVar1 + -0x10;
      if (*(char *)(lVar1 + -0x10) != '\x01') {
        *(undefined4 *)(**(long **)local_10[2] + 0x68) = 0;
        runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                in_stack_fffffffffffffbdc);
      }
      in_stack_fffffffffffffbf8 = *(vocerr_va_info **)(*(long *)(local_10[2] + 0x20) + 8);
      *local_38 = (int)in_stack_fffffffffffffbf8;
      if (0 < *local_38) {
        *local_38 = *local_38 + -1;
      }
      if (*local_38 < 0) {
        *local_38 = 0;
      }
      else if (local_2c < *local_38) {
        *local_38 = local_2c;
      }
      for (local_60 = 0; local_60 < *local_38; local_60 = local_60 + 1) {
        if (((*(uint *)(local_28 + (long)local_60 * 4) & 0x80) != 0) &&
           (0 < *(int *)((long)local_10 + 0x119c))) {
          *(int *)((long)local_10 + 0x119c) = *(int *)((long)local_10 + 0x119c) + -1;
        }
      }
    }
    else if ((in_stack_fffffffffffffc04 == 5) || (in_stack_fffffffffffffc04 != 8)) {
      *(long *)(local_10[2] + 0x20) = *(long *)(local_10[2] + 0x20) + -0x10;
      local_3c = 1;
    }
    else {
      *(long *)(local_10[2] + 0x20) = *(long *)(local_10[2] + 0x20) + -0x10;
      *local_38 = local_2c;
      *(undefined4 *)((long)local_10 + 0x119c) = 0;
    }
    *(undefined8 *)*local_10 = local_1a0;
    iVar2 = in_stack_fffffffffffffbf4;
  }
  else {
    *(undefined8 *)*local_10 = local_1a0;
    local_5c = iVar2;
    if (iVar2 != 0x3f5) {
      if (iVar2 == 0x3f6) {
        local_64 = 0;
        *(undefined4 *)((long)local_10 + 0x119c) = 0;
        goto LAB_00235d0f;
      }
      if (iVar2 != 0x3fb) {
        errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                (errdef *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      }
    }
    *(undefined4 *)((long)local_10 + 0x119c) = 0;
  }
LAB_00235d0f:
  if (local_3c == 0) {
    iVar2 = exe_fuses_and_daemons
                      (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                       ,in_stack_fffffffffffffd26,in_stack_fffffffffffffd24,
                       (vocoldef *)
                       CONCAT26(in_stack_fffffffffffffd1e,
                                CONCAT24(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)),
                       in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50
                      );
    if (iVar2 != 0) {
      return 0;
    }
    return 1;
  }
LAB_00235d87:
  if (*(int *)((long)local_10 + 0x119c) == 0) {
    local_48 = &stack0xfffffffffffffc08;
    local_50 = &stack0x00000020;
    local_54 = 0x30;
    local_58 = 0x30;
    vocerr_va_prep(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                   in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    local_48 = &stack0xfffffffffffffc08;
    local_50 = &stack0x00000020;
    local_54 = 0x30;
    local_58 = 0x30;
    vocerr_va((voccxdef *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
              in_stack_fffffffffffffbf8,iVar2,
              (char *)CONCAT26(in_stack_fffffffffffffbee,
                               CONCAT24(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)),
              (__va_list_tag *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  }
  return 0;
}

Assistant:

int try_unknown_verb(voccxdef *ctx, objnum actor,
                     char **cmd, int *typelist, int wrdcnt, int *next_start,
                     int do_fuses, int vocerr_err, char *vocerr_msg, ...)
{
    int  show_msg;
    va_list  argptr;

    /* presume we won't show the message */
    show_msg = FALSE;

    /* determine the word count if the caller passed in zero */
    if (wrdcnt == 0)
    {
        /* count the words before the terminating null entry */
        for ( ; cmd[wrdcnt] != 0 ; ++wrdcnt) ;
    }

    /* if parseUnknownVerb exists, call it */
    if (ctx->voccxpuv != MCMONINV)
    {
        int  err;
        int  i;
        int  do_fuses;

        /* no error has occurred yet */
        err = 0;

        /* presume we will run the fuses */
        do_fuses = TRUE;

        /* push the error number argument */
        runpnum(ctx->voccxrun, (long)vocerr_err);

        /* push a list of the word types */
        voc_push_numlist(ctx, (uint *)typelist, wrdcnt);

        /* push a list of the words */
        voc_push_toklist(ctx, cmd, wrdcnt);

        /* use "Me" as the default actor */
        if (actor == MCMONINV)
            actor = ctx->voccxme;

        /* push the actor argument */
        runpobj(ctx->voccxrun, actor);

        /* catch any errors that occur while calling the function */
        ERRBEGIN(ctx->voccxerr)
        {
            /* invoke the function */
            runfn(ctx->voccxrun, ctx->voccxpuv, 4);

            /* get the return value */
            switch(runtostyp(ctx->voccxrun))
            {
            case DAT_TRUE:
                /* the command was handled */
                rundisc(ctx->voccxrun);

                /* consume the entire command */
                *next_start = wrdcnt;

                /* 
                 *   since the command has now been handled, forget about
                 *   any unknown words 
                 */
                ctx->voccxunknown = 0;
                break;

            case DAT_NUMBER:
                /* 
                 *   The command was handled, and the function indicated
                 *   the number of words it wants to skip.  Communicate
                 *   this information back to the caller in *next_start.
                 *   Since the routine returns the 1-based index of the
                 *   next entry, we must subtract one to get the number of
                 *   words actually consumed.  
                 */
                *next_start = runpopnum(ctx->voccxrun);
                if (*next_start > 0)
                    --(*next_start);

                /* make sure the value is in range */
                if (*next_start < 0)
                    *next_start = 0;
                else if (*next_start > wrdcnt)
                    *next_start = wrdcnt;

                /* 
                 *   forget about any unknown words in the list up to the
                 *   next word 
                 */
                for (i = 0 ; i < *next_start ; ++i)
                {
                    /* if this word was unknown, forget about that now */
                    if ((typelist[i] & VOCT_UNKNOWN) != 0
                        && ctx->voccxunknown > 0)
                        --(ctx->voccxunknown);
                }
                break;

            default:
                /* treat anything else like nil */

            case DAT_NIL:
                /* nil - command not handled; show the message */
                rundisc(ctx->voccxrun);
                show_msg = TRUE;
                break;
            }
        }
        ERRCATCH(ctx->voccxerr, err)
        {
            /* check the error */
            switch(err)
            {
            case ERR_RUNEXIT:
            case ERR_RUNEXITOBJ:
                /* 
                 *   Exit or exitobj was executed - skip to the fuses.
                 *   Forget about any unknown words, since we've finished
                 *   processing this command and we don't want to allow
                 *   "oops" processing.  
                 */
                ctx->voccxunknown = 0;
                break;

            case ERR_RUNABRT:
                /* 
                 *   abort was executed - skip to the end of the command,
                 *   but do not execute the fuses 
                 */
                do_fuses = FALSE;

                /*
                 *   Since we're aborting the command, ignore any
                 *   remaining unknown words - we're skipping out of the
                 *   command entirely, so we don't care that there were
                 *   unknown words in the command.  
                 */
                ctx->voccxunknown = 0;
                break;

            default:
                /* re-throw any other errors */
                errrse(ctx->voccxerr);
            }
        }
        ERREND(ctx->voccxerr);

        /* if we're not showing the message, process fuses and daemons */
        if (!show_msg)
        {
            /* execute fuses and daemons */
            if (exe_fuses_and_daemons(ctx, err, do_fuses,
                                      actor, MCMONINV, 0, 0,
                                      MCMONINV, MCMONINV) != 0)
            {
                /* 
                 *   aborted from fuses and daemons - return false to tell
                 *   the caller not to execute anything left on the
                 *   command line 
                 */
                return FALSE;
            }

            /* indicate that the game code successfully handled the command */
            return TRUE;
        }
    }

    /* 
     *   If we made it here, it means we're showing the default message.
     *   If we have unknown words, suppress the message so that we show
     *   the unknown word error instead after returning.
     */
    if (ctx->voccxunknown == 0)
    {
        struct vocerr_va_info info;

        /* prepare to format the message */
        va_start(argptr, vocerr_msg);
        vocerr_va_prep(ctx, &info, vocerr_err, vocerr_msg, argptr);
        va_end(argptr);

        /* format the mesage */
        va_start(argptr, vocerr_msg);
        vocerr_va(ctx, &info, vocerr_err, vocerr_msg, argptr);
        va_end(argptr);
    }

    /* indicate that the remainder of the command should be aborted */
    return FALSE;
}